

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeLoadInt32FromPointer
               (CodeGenRegVmContext *ctx,x86Reg tempReg,x86Reg targetReg,uchar reg,uint offset)

{
  int value;
  uint offset_local;
  uchar reg_local;
  x86Reg targetReg_local;
  x86Reg tempReg_local;
  CodeGenRegVmContext *ctx_local;
  
  if (reg == '\x03') {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,targetReg,sDWORD,rEBX,offset);
  }
  else if (reg == '\x01') {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,targetReg,sDWORD,rR15,offset);
  }
  else if (reg == '\x02') {
    if (ctx->exRegVmConstants[offset >> 2] == 0) {
      EMIT_OP_REG_REG(&ctx->ctx,o_xor,targetReg,targetReg);
    }
    else {
      EMIT_OP_REG_NUM(&ctx->ctx,o_mov,targetReg,ctx->exRegVmConstants[offset >> 2]);
    }
  }
  else {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,tempReg,sQWORD,rEBX,(uint)reg << 3);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,targetReg,sDWORD,tempReg,offset);
  }
  return;
}

Assistant:

void GenCodeLoadInt32FromPointer(CodeGenRegVmContext &ctx, x86Reg tempReg, x86Reg targetReg, unsigned char reg, unsigned offset)
{
	if(reg == rvrrRegisters)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, rREG, offset); // Load int value
	}
	else if(reg == rvrrFrame)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, rR15, offset); // Load int value
	}
	else if(reg == rvrrConstants)
	{
		// Load int immediate
		int value = ctx.exRegVmConstants[offset >> 2];

		if(value == 0)
			EMIT_OP_REG_REG(ctx.ctx, o_xor, targetReg, targetReg);
		else
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, targetReg, value);
	}
	else
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, tempReg, sQWORD, rREG, reg * 8); // Load source pointer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, tempReg, offset); // Load int value
	}
}